

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void google::protobuf::TestCtorAndDtorTraits<true,true>
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *def,vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *copy,
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *with_int)

{
  pointer pbVar1;
  int iVar2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *container;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *matcher;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *container_00;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *matcher_00;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *container_01;
  ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *matcher_01;
  char *pcVar3;
  AssertHelper AStack_138;
  AssertionResult gtest_ar_1;
  TraitsProber p;
  Arena arena;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_50;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_38;
  
  if (TestCtorAndDtorTraits<true,true>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)
      ::actions == '\0') {
    iVar2 = __cxa_guard_acquire(&TestCtorAndDtorTraits<true,true>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)
                                 ::actions);
    if (iVar2 != 0) {
      TestCtorAndDtorTraits<true,_true>::actions =
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)operator_new(0x18);
      (TestCtorAndDtorTraits<true,_true>::actions->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (TestCtorAndDtorTraits<true,_true>::actions->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (TestCtorAndDtorTraits<true,_true>::actions->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_guard_release(&TestCtorAndDtorTraits<true,true>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)
                           ::actions);
    }
  }
  pbVar1 = (TestCtorAndDtorTraits<true,_true>::actions->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((TestCtorAndDtorTraits<true,_true>::actions->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    (TestCtorAndDtorTraits<true,_true>::actions->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  }
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  Arena::
  DefaultConstruct<google::protobuf::TestCtorAndDtorTraits<true,true>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber>
            ((Arena *)&arena.impl_);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  testing::
  ElementsAreArray<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            ((ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             &local_38,(testing *)def,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&arena,(internal *)&local_38,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
  ::operator()(&p,(char *)&arena,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"actions");
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&arena);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_38);
  if ((char)p.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&arena);
    if (p.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)p.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&arena);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (arena.impl_.tag_and_id_ != 0) {
      (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&p.super_Message.super_MessageLite._internal_metadata_);
  TestCtorAndDtorTraits<true,_true>::TraitsProber::TraitsProber(&p);
  pbVar1 = (TestCtorAndDtorTraits<true,_true>::actions->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((TestCtorAndDtorTraits<true,_true>::actions->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    (TestCtorAndDtorTraits<true,_true>::actions->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  }
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  Arena::
  CopyConstruct<google::protobuf::TestCtorAndDtorTraits<true,true>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber>
            (&arena,&p);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  testing::
  ElementsAreArray<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            ((ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             &local_50,(testing *)copy,container_00);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&arena,(internal *)&local_50,matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
  ::operator()(&gtest_ar_1,(char *)&arena,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"actions");
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&arena);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_50);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&arena);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&arena);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if (arena.impl_.tag_and_id_ != 0) {
      (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  pbVar1 = (TestCtorAndDtorTraits<true,_true>::actions->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((TestCtorAndDtorTraits<true,_true>::actions->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    (TestCtorAndDtorTraits<true,_true>::actions->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  }
  internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  Arena::
  DoCreateMessage<google::protobuf::TestCtorAndDtorTraits<true,true>(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>)::TraitsProber,int>
            (&arena,(int *)&gtest_ar_1);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  testing::
  ElementsAreArray<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
            ((ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             &local_68,(testing *)with_int,container_01);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
            ((PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&arena,(internal *)&local_68,matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<std::basic_string_view<char,std::char_traits<char>>>>
  ::operator()(&gtest_ar_1,(char *)&arena,
               (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"actions");
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)&arena);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_68);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&arena);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0xf1,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&arena);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if (arena.impl_.tag_and_id_ != 0) {
      (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  TestCtorAndDtorTraits<true,_true>::TraitsProber::~TraitsProber(&p);
  return;
}

Assistant:

void TestCtorAndDtorTraits(std::vector<absl::string_view> def,
                           std::vector<absl::string_view> copy,
                           std::vector<absl::string_view> with_int) {
  static auto& actions = *new std::vector<absl::string_view>;
  struct TraitsProber
      : std::conditional_t<arena_ctor, ArenaCtorBase, EmptyBase<0>>,
        std::conditional_t<arena_dtor, ArenaDtorBase, EmptyBase<1>>,
        Message {
    TraitsProber() : Message(nullptr, nullptr) { actions.push_back("()"); }
    TraitsProber(const TraitsProber&) : Message(nullptr, nullptr) {
      actions.push_back("(const T&)");
    }
    explicit TraitsProber(int) : Message(nullptr, nullptr) {
      actions.push_back("(int)");
    }
    explicit TraitsProber(Arena* arena) : Message(nullptr, nullptr) {
      actions.push_back("(Arena)");
    }
    TraitsProber(Arena* arena, const TraitsProber&)
        : Message(nullptr, nullptr) {
      actions.push_back("(Arena, const T&)");
    }
    TraitsProber(Arena* arena, int) : Message(nullptr, nullptr) {
      actions.push_back("(Arena, int)");
    }
    ~TraitsProber() { actions.push_back("~()"); }

    TraitsProber* New(Arena*) const {
      ABSL_LOG(FATAL);
      return nullptr;
    }
    const internal::ClassData* GetClassData() const PROTOBUF_FINAL {
      ABSL_LOG(FATAL);
      return nullptr;
    }
  };

  static_assert(
      !arena_ctor || Arena::is_arena_constructable<TraitsProber>::value, "");
  static_assert(
      !arena_dtor || Arena::is_destructor_skippable<TraitsProber>::value, "");

  {
    actions.clear();
    Arena arena;
    Arena::Create<TraitsProber>(&arena);
  }
  EXPECT_THAT(actions, ElementsAreArray(def));

  const TraitsProber p;
  {
    actions.clear();
    Arena arena;
    Arena::Create<TraitsProber>(&arena, p);
  }
  EXPECT_THAT(actions, ElementsAreArray(copy));

  {
    actions.clear();
    Arena arena;
    Arena::Create<TraitsProber>(&arena, 17);
  }
  EXPECT_THAT(actions, ElementsAreArray(with_int));
}